

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language,string *config,string *objectFileName)

{
  short *psVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  cmLocalNinjaGenerator *pcVar4;
  long *plVar5;
  cmMakefile *pcVar6;
  int iVar7;
  string *psVar8;
  cmValue cVar9;
  string *psVar10;
  iterator iVar11;
  cmFileSet *pcVar12;
  string *psVar13;
  pointer pbVar14;
  size_type sVar15;
  cmRulePlaceholderExpander *pcVar16;
  pointer arch;
  bool bVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string COMPILE_FLAGS;
  string COMPILE_OPTIONS;
  string filterArch;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string pchOptions;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pchSources;
  undefined1 local_3c8 [32];
  string *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_398;
  undefined1 local_380 [32];
  string local_360;
  string local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_300;
  bool local_2e0;
  string *local_2d8;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  cmGeneratorExpressionInterpreter local_230;
  undefined1 local_1c0 [32];
  _Alloc_hider local_1a0;
  char *local_198;
  undefined1 local_190 [16];
  char *local_180;
  char *local_178;
  pointer local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  pointer local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar3 = (language->_M_dataplus)._M_p;
  local_300._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_300._M_value + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar3,pcVar3 + language->_M_string_length);
  local_2e0 = true;
  cmGeneratorTarget::GetAppleArchs
            (&local_398,pcVar2,config,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_300);
  local_3a8 = __return_storage_ptr__;
  local_2d8 = objectFileName;
  if ((local_2e0 == true) &&
     (local_2e0 = false,
     local_300._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_300._M_value + 0x10))) {
    operator_delete((void *)local_300._M_value._M_dataplus._M_p,local_300._16_8_ + 1);
  }
  pbVar14 = local_398.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  arch = local_398.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if (local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_398.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&local_398);
    pbVar14 = local_398.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    arch = local_398.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  local_320._M_allocated_capacity = (size_type)&local_310;
  local_320._8_8_ = 0;
  local_310._M_local_buf[0] = '\0';
  if (arch != pbVar14) {
    do {
      cmGeneratorTarget::GetPchSource
                ((string *)&local_230,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
                 language,arch);
      psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      if (local_230.GeneratorExpression.Backtrace.
          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)psVar8->_M_string_length) {
        if ((local_230.GeneratorExpression.Backtrace.
             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr == (element_type *)0x0) ||
           (iVar7 = bcmp(local_230.GeneratorExpression.CMakeInstance,(psVar8->_M_dataplus)._M_p,
                         (size_t)local_230.GeneratorExpression.Backtrace.
                                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                                 .
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr), iVar7 == 0)) {
          std::__cxx11::string::_M_assign((string *)local_320._M_local_buf);
          goto LAB_0046adda;
        }
LAB_0046addf:
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230,
                   arch);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1c0);
        if (local_1a0._M_p != local_190) {
          operator_delete(local_1a0._M_p,local_190._0_8_ + 1);
        }
        if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
          operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
        }
      }
      else {
LAB_0046adda:
        if (local_230.GeneratorExpression.Backtrace.
            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) goto LAB_0046addf;
      }
      if (local_230.GeneratorExpression.CMakeInstance !=
          (cmake *)&local_230.GeneratorExpression.Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount) {
        operator_delete(local_230.GeneratorExpression.CMakeInstance,
                        (ulong)((long)&(local_230.GeneratorExpression.Backtrace.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      arch = arch + 1;
    } while (arch != pbVar14);
  }
  psVar8 = local_3a8;
  local_3a0 = &local_3a8->field_2;
  (local_3a8->_M_dataplus)._M_p = (pointer)local_3a0;
  local_3a8->_M_string_length = 0;
  (local_3a8->field_2)._M_local_buf[0] = '\0';
  cmGeneratorTarget::AddExplicitLanguageFlags
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,local_3a8,source);
  if (psVar8->_M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar8);
  }
  cmCommonTargetGenerator::GetFlags
            ((string *)local_1c0,&this->super_cmCommonTargetGenerator,language,config,
             (string *)&local_320);
  std::__cxx11::string::_M_append((char *)psVar8,local_1c0._0_8_);
  if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
  iVar7 = std::__cxx11::string::compare((char *)language);
  if (iVar7 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,psVar8,source);
    cmCommonTargetGenerator::AppendFortranPreprocessFlags
              (&this->super_cmCommonTargetGenerator,psVar8,source,NO);
  }
  pcVar4 = this->LocalGenerator;
  pcVar3 = (config->_M_dataplus)._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar3,pcVar3 + config->_M_string_length);
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar3 = (language->_M_dataplus)._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar3,pcVar3 + language->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_230,(cmLocalGenerator *)pcVar4,&local_250,pcVar2,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  psVar1 = (short *)(local_1c0 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"COMPILE_FLAGS","");
  cVar9 = cmSourceFile::GetProperty(source,&local_360);
  if (cVar9.Value != (string *)0x0) {
    pcVar4 = this->LocalGenerator;
    pcVar3 = ((cVar9.Value)->_M_dataplus)._M_p;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar3,pcVar3 + (cVar9.Value)->_M_string_length);
    psVar10 = cmGeneratorExpressionInterpreter::Evaluate(&local_230,&local_290,&local_360);
    (*(pcVar4->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[7])(pcVar4,psVar8,psVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"COMPILE_OPTIONS","");
  cVar9 = cmSourceFile::GetProperty(source,&local_340);
  if (cVar9.Value != (string *)0x0) {
    pcVar4 = this->LocalGenerator;
    pcVar3 = ((cVar9.Value)->_M_dataplus)._M_p;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar3,pcVar3 + (cVar9.Value)->_M_string_length);
    psVar10 = cmGeneratorExpressionInterpreter::Evaluate(&local_230,&local_2b0,&local_340);
    cmLocalGenerator::AppendCompileOptions((cmLocalGenerator *)pcVar4,psVar8,psVar10,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68._M_element_count == 0) goto LAB_0046b388;
  local_1c0._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"SKIP_PRECOMPILE_HEADERS","");
  cVar9 = cmSourceFile::GetProperty(source,(string *)local_1c0);
  if ((short *)local_1c0._0_8_ != psVar1) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
  if (cVar9.Value != (string *)0x0) goto LAB_0046b388;
  local_1c0._8_8_ = (char *)0x0;
  local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
  local_1c0._0_8_ = psVar1;
  psVar10 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  iVar11 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&local_68,psVar10);
  if (iVar11.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_380._8_8_ = 0;
    local_380[0x10] = '\0';
    local_380._0_8_ = (cmRulePlaceholderExpander *)(local_380 + 0x10);
    cmGeneratorTarget::GetPchUseCompileOptions
              ((string *)local_3c8,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,(string *)local_380);
    std::__cxx11::string::operator=((string *)local_1c0,(string *)local_3c8);
    if ((cmRulePlaceholderExpander *)local_3c8._0_8_ !=
        (cmRulePlaceholderExpander *)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
    }
    if ((cmRulePlaceholderExpander *)local_380._0_8_ !=
        (cmRulePlaceholderExpander *)(local_380 + 0x10)) {
      sVar15 = CONCAT71(local_380._17_7_,local_380[0x10]);
      pcVar16 = (cmRulePlaceholderExpander *)local_380._0_8_;
      goto LAB_0046b2e1;
    }
  }
  else {
    cmGeneratorTarget::GetPchCreateCompileOptions
              ((string *)local_3c8,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
               language,(string *)
                        ((long)iVar11.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur + 0x28));
    std::__cxx11::string::operator=((string *)local_1c0,(string *)local_3c8);
    sVar15 = local_3c8._16_8_;
    pcVar16 = (cmRulePlaceholderExpander *)local_3c8._0_8_;
    if ((cmRulePlaceholderExpander *)local_3c8._0_8_ !=
        (cmRulePlaceholderExpander *)(local_3c8 + 0x10)) {
LAB_0046b2e1:
      operator_delete(pcVar16,sVar15 + 1);
    }
  }
  pcVar4 = this->LocalGenerator;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_1c0._0_8_,(char *)(local_1c0._8_8_ + local_1c0._0_8_));
  psVar10 = cmGeneratorExpressionInterpreter::Evaluate(&local_230,&local_2d0,&local_340);
  cmLocalGenerator::AppendCompileOptions((cmLocalGenerator *)pcVar4,psVar8,psVar10,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((short *)local_1c0._0_8_ != psVar1) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
  }
LAB_0046b388:
  pcVar12 = cmGeneratorTarget::GetFileSetForSource
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget,config,source);
  if (((pcVar12 != (cmFileSet *)0x0) && ((pcVar12->Type)._M_string_length == 0xb)) &&
     (plVar5 = (long *)(pcVar12->Type)._M_dataplus._M_p,
     *(long *)((long)plVar5 + 3) == 0x53454c55444f4d5f && *plVar5 == 0x55444f4d5f585843)) {
    cmSourceFile::GetLanguage_abi_cxx11_((string *)local_1c0,source);
    bVar17 = true;
    if ((char *)local_1c0._8_8_ == (char *)0x3) {
      bVar17 = (char)*(short *)(local_1c0._0_8_ + 2) != 'X' || *(short *)local_1c0._0_8_ != 0x5843;
    }
    if ((short *)local_1c0._0_8_ != psVar1) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    psVar8 = local_3a8;
    if (bVar17) {
      pcVar6 = (this->super_cmCommonTargetGenerator).Makefile;
      psVar10 = cmTarget::GetName_abi_cxx11_
                          (((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
      psVar13 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      local_1c0._0_8_ = (short *)0x8;
      local_1c0._8_8_ = "Target \"";
      local_1c0._16_8_ = 0;
      local_1a0._M_p = (psVar10->_M_dataplus)._M_p;
      local_1c0._24_8_ = psVar10->_M_string_length;
      local_198 = (char *)0x0;
      local_190._0_8_ = 0x18;
      local_190._8_8_ = "\" contains the source\n  ";
      local_180 = (char *)0x0;
      local_170 = (psVar13->_M_dataplus)._M_p;
      local_178 = (char *)psVar13->_M_string_length;
      local_168 = (char *)0x0;
      local_160 = (char *)0x18;
      local_158 = "\nin a file set of type \"";
      local_150 = (char *)0x0;
      local_140 = (pcVar12->Type)._M_dataplus._M_p;
      local_148 = (char *)(pcVar12->Type)._M_string_length;
      local_138 = (char *)0x0;
      local_130 = (char *)0x35;
      local_128 = "\" but the source is not classified as a \"CXX\" source.";
      local_120 = (char *)0x0;
      views._M_len = 7;
      views._M_array = (iterator)local_1c0;
      cmCatViews((string *)local_3c8,views);
      cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,(string *)local_3c8);
      if ((cmRulePlaceholderExpander *)local_3c8._0_8_ !=
          (cmRulePlaceholderExpander *)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
      }
    }
    bVar17 = cmTarget::IsNormal(((this->super_cmCommonTargetGenerator).GeneratorTarget)->Target);
    if (!bVar17) {
      pcVar6 = (this->super_cmCommonTargetGenerator).Makefile;
      local_1c0._0_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"CMAKE_CXX_MODULE_BMI_ONLY_FLAG","");
      psVar10 = cmMakefile::GetSafeDefinition(pcVar6,(string *)local_1c0);
      pcVar3 = (psVar10->_M_dataplus)._M_p;
      local_3c8._0_8_ = (cmRulePlaceholderExpander *)(local_3c8 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_3c8,pcVar3,pcVar3 + psVar10->_M_string_length);
      if ((short *)local_1c0._0_8_ != psVar1) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      memset(local_1c0,0,0x158);
      local_140 = (local_2d8->_M_dataplus)._M_p;
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[6])(local_380);
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)local_380._0_8_,
                 (cmOutputConverter *)this->LocalGenerator,(string *)local_3c8,
                 (RuleVariables *)local_1c0);
      cmLocalGenerator::AppendCompileOptions
                ((cmLocalGenerator *)this->LocalGenerator,psVar8,(string *)local_3c8,(char *)0x0);
      if ((cmRulePlaceholderExpander *)local_380._0_8_ != (cmRulePlaceholderExpander *)0x0) {
        (**(code **)(*(long *)local_380._0_8_ + 8))();
      }
      if ((cmRulePlaceholderExpander *)local_3c8._0_8_ !=
          (cmRulePlaceholderExpander *)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.Language._M_dataplus._M_p != &local_230.Language.field_2) {
    operator_delete(local_230.Language._M_dataplus._M_p,
                    local_230.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.Config._M_dataplus._M_p != &local_230.Config.field_2) {
    operator_delete(local_230.Config._M_dataplus._M_p,
                    local_230.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_230.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&local_230.GeneratorExpression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_allocated_capacity != &local_310) {
    operator_delete((void *)local_320._M_allocated_capacity,
                    CONCAT71(local_310._M_allocated_capacity._1_7_,local_310._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_398);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return psVar8;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language,
  const std::string& config, const std::string& objectFileName)
{
  std::unordered_map<std::string, std::string> pchSources;
  std::vector<std::string> architectures =
    this->GeneratorTarget->GetAppleArchs(config, language);
  if (architectures.empty()) {
    architectures.emplace_back();
  }

  std::string filterArch;
  for (const std::string& arch : architectures) {
    const std::string pchSource =
      this->GeneratorTarget->GetPchSource(config, language, arch);
    if (pchSource == source->GetFullPath()) {
      filterArch = arch;
    }
    if (!pchSource.empty()) {
      pchSources.insert(std::make_pair(pchSource, arch));
    }
  }

  std::string flags;
  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  this->GeneratorTarget->AddExplicitLanguageFlags(flags, *source);

  if (!flags.empty()) {
    flags += " ";
  }
  flags += this->GetFlags(language, config, filterArch);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
    this->AppendFortranPreprocessFlags(flags, *source,
                                       PreprocessFlagsRequired::NO);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, config, this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  // Add precompile headers compile options.
  if (!pchSources.empty() && !source->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
    std::string pchOptions;
    auto pchIt = pchSources.find(source->GetFullPath());
    if (pchIt != pchSources.end()) {
      pchOptions = this->GeneratorTarget->GetPchCreateCompileOptions(
        config, language, pchIt->second);
    } else {
      pchOptions =
        this->GeneratorTarget->GetPchUseCompileOptions(config, language);
    }

    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(pchOptions, COMPILE_OPTIONS));
  }

  auto const* fs = this->GeneratorTarget->GetFileSetForSource(config, source);
  if (fs && fs->GetType() == "CXX_MODULES"_s) {
    if (source->GetLanguage() != "CXX"_s) {
      this->GetMakefile()->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Target \"", this->GeneratorTarget->Target->GetName(),
                 "\" contains the source\n  ", source->GetFullPath(),
                 "\nin a file set of type \"", fs->GetType(),
                 R"(" but the source is not classified as a "CXX" source.)"));
    }

    if (!this->GeneratorTarget->Target->IsNormal()) {
      auto flag = this->GetMakefile()->GetSafeDefinition(
        "CMAKE_CXX_MODULE_BMI_ONLY_FLAG");
      cmRulePlaceholderExpander::RuleVariables compileObjectVars;
      compileObjectVars.Object = objectFileName.c_str();
      auto rulePlaceholderExpander =
        this->GetLocalGenerator()->CreateRulePlaceholderExpander();
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   flag, compileObjectVars);
      this->LocalGenerator->AppendCompileOptions(flags, flag);
    }
  }

  return flags;
}